

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Options *options;
  code *pcVar2;
  pointer ppFVar3;
  FieldDescriptor *pFVar4;
  long lVar5;
  bool bVar6;
  CType CVar7;
  FileOptions_OptimizeMode FVar8;
  undefined8 *puVar9;
  pointer ppFVar10;
  FieldGenerator *pFVar11;
  int iVar12;
  Options *in_RCX;
  long lVar13;
  FieldDescriptor *field;
  size_type sVar14;
  difference_type __n;
  ulong uVar15;
  undefined8 uVar16;
  Descriptor *pDVar17;
  MessageGenerator *pMVar18;
  byte bVar19;
  vector<bool,_std::allocator<bool>_> processed;
  Iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string initializer_with_arena;
  string initializer_null;
  Formatter format;
  string superclass;
  Iterator __begin5;
  Iterator __end5;
  Iterator __end4;
  string local_1d0;
  undefined1 local_1b0 [16];
  Descriptor *local_1a0;
  uint uStack_198;
  undefined4 uStack_194;
  _Bit_pointer local_190;
  MessageGenerator *local_188;
  Printer *local_180;
  FieldDescriptor *local_178;
  Descriptor *local_170;
  Descriptor *local_168 [2];
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Base_ptr local_138;
  size_t local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  Formatter local_e8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  Iterator local_90;
  OneofDescriptor *local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  Iterator local_50;
  Iterator local_40;
  
  local_180 = printer;
  local_e8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_e8.vars_._M_t,&(this->variables_)._M_t);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  options = &this->options_;
  SuperClassName_abi_cxx11_
            ((string *)local_158,(cpp *)this->descriptor_,(Descriptor *)options,in_RCX);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_128,local_b0,local_b0 + local_a8);
  std::__cxx11::string::append((char *)&local_128);
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    std::__cxx11::string::append((char *)&local_128);
  }
  ppFVar10 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = this;
  if (ppFVar10 != ppFVar3) {
    do {
      pFVar4 = *ppFVar10;
      bVar19 = (byte)pFVar4[1] & 0x60;
      lVar5 = *(long *)(pFVar4 + 0x28);
      if ((lVar5 == 0 || ((byte)pFVar4[1] & 0x10) == 0) ||
         ((*(int *)(lVar5 + 4) == 1 &&
          (((*(byte *)(*(long *)(lVar5 + 0x20) + 1) & 2) != 0 || (lVar5 == 0)))))) {
        bVar6 = IsLazy(pFVar4,options,local_188->scc_analyzer_);
        if (!bVar6) {
          if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
            local_158._0_8_ = FieldDescriptor::TypeOnceInit;
            local_1b0._0_8_ = pFVar4;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_158,
                       (FieldDescriptor **)local_1b0);
          }
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4) != 9) ||
             (CVar7 = EffectiveStringCType(pFVar4,options), CVar7 != FieldOptions_CType_STRING_PIECE
             )) {
            if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
              local_158._0_8_ = FieldDescriptor::TypeOnceInit;
              local_1b0._0_8_ = pFVar4;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_158
                         ,(FieldDescriptor **)local_1b0);
            }
            if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4) != 9) ||
               (CVar7 = EffectiveStringCType(pFVar4,options), CVar7 != FieldOptions_CType_STRING))
            goto LAB_002a8d09;
            bVar6 = IsStringInlined(pFVar4,options);
            if (bVar19 != 0x60 && !bVar6) goto LAB_002a8f4e;
          }
        }
LAB_002a8d13:
        local_108 = local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,",\n  ","");
        FieldName_abi_cxx11_(&local_1d0,(cpp *)pFVar4,field);
        uVar15 = 0xf;
        if (local_108 != local_f8) {
          uVar15 = local_f8[0];
        }
        if (uVar15 < local_1d0._M_string_length + local_100) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            uVar16 = local_1d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_1d0._M_string_length + local_100) goto LAB_002a8d8e;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_108);
        }
        else {
LAB_002a8d8e:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_108,(ulong)local_1d0._M_dataplus._M_p);
        }
        pFVar4 = (FieldDescriptor *)(puVar9 + 2);
        if ((FieldDescriptor *)*puVar9 == pFVar4) {
          local_1a0 = *(Descriptor **)pFVar4;
          uStack_198 = *(uint *)(puVar9 + 3);
          uStack_194 = *(undefined4 *)((long)puVar9 + 0x1c);
          local_1b0._0_8_ = (FieldDescriptor *)&local_1a0;
        }
        else {
          local_1a0 = *(Descriptor **)pFVar4;
          local_1b0._0_8_ = (FieldDescriptor *)*puVar9;
        }
        local_1b0._8_8_ = puVar9[1];
        *puVar9 = pFVar4;
        puVar9[1] = 0;
        *pFVar4 = (FieldDescriptor)0x0;
        local_178 = (FieldDescriptor *)local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_(arena)","");
        pDVar17 = (Descriptor *)0xf;
        if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)&local_1a0) {
          pDVar17 = local_1a0;
        }
        if (pDVar17 < local_170 + local_1b0._8_8_) {
          pDVar17 = (Descriptor *)0xf;
          if (local_178 != (FieldDescriptor *)local_168) {
            pDVar17 = local_168[0];
          }
          if (pDVar17 < local_170 + local_1b0._8_8_) goto LAB_002a8e58;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,local_1b0._0_8_);
        }
        else {
LAB_002a8e58:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_1b0,(ulong)local_178);
        }
        local_158._0_8_ = local_158 + 0x10;
        pcVar2 = (code *)(puVar9 + 2);
        if ((code *)*puVar9 == pcVar2) {
          local_148._M_allocated_capacity = *(undefined8 *)pcVar2;
          local_148._8_8_ = puVar9[3];
        }
        else {
          local_148._M_allocated_capacity = *(undefined8 *)pcVar2;
          local_158._0_8_ = (code *)*puVar9;
        }
        local_158._8_8_ = puVar9[1];
        *puVar9 = pcVar2;
        puVar9[1] = 0;
        *pcVar2 = (code)0x0;
        std::__cxx11::string::_M_append((char *)&local_128,local_158._0_8_);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_);
        }
        if (local_178 != (FieldDescriptor *)local_168) {
          operator_delete(local_178);
        }
        if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)&local_1a0) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
      }
      else {
LAB_002a8d09:
        if (bVar19 == 0x60) goto LAB_002a8d13;
      }
LAB_002a8f4e:
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar3);
  }
  pMVar18 = local_188;
  bVar6 = IsAnyMessage(local_188->descriptor_,options);
  if (bVar6) {
    std::__cxx11::string::append((char *)&local_128);
  }
  if (0 < pMVar18->num_weak_fields_) {
    std::__cxx11::string::append((char *)&local_128);
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_b0,local_b0 + local_a8);
  std::__cxx11::string::append((char *)&local_108);
  bVar6 = IsAnyMessage(pMVar18->descriptor_,options);
  if (bVar6) {
    std::__cxx11::string::append((char *)&local_108);
  }
  if (0 < pMVar18->num_weak_fields_) {
    std::__cxx11::string::append((char *)&local_108);
  }
  Formatter::operator()
            (&local_e8,
             "$classname$::$classname$(::$proto_ns$::Arena* arena,\n                         bool is_message_owned)\n  : $1$ {\n"
             ,&local_128);
  if ((pMVar18->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar18->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Formatter::operator()<>(&local_e8,"  if (arena != nullptr) {\n");
    local_158._0_8_ = (code *)0x0;
    if (0x3e < pMVar18->max_inlined_string_index_ + 0x3eU) {
      do {
        Formatter::operator()
                  (&local_e8,"    _inlined_string_donated_[$1$] = ~0u;\n",(unsigned_long *)local_158
                  );
        local_158._0_8_ = local_158._0_8_ + 1;
        iVar1 = pMVar18->max_inlined_string_index_ + 0x1f;
        iVar12 = pMVar18->max_inlined_string_index_ + 0x3e;
        if (-1 < iVar1) {
          iVar12 = iVar1;
        }
      } while ((ulong)local_158._0_8_ < (code *)(long)(iVar12 >> 5));
    }
    Formatter::operator()<>(&local_e8,"  }\n");
  }
  pDVar17 = pMVar18->descriptor_;
  FVar8 = GetOptimizeFor(*(FileDescriptor **)(pDVar17 + 0x10),options,(bool *)0x0);
  if (((FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar17 + 0x78) != 0)) ||
     (*(int *)(pDVar17 + 4) != 0)) {
    Formatter::operator()<>
              (&local_e8,
               "  SharedCtor();\n  if (!is_message_owned) {\n    RegisterArenaDtor(arena);\n  }\n");
  }
  Formatter::operator()<>
            (&local_e8,"  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n");
  local_148._8_8_ = local_158 + 8;
  local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
  local_148._M_allocated_capacity = 0;
  local_130 = 0;
  local_138 = (_Base_ptr)local_148._8_8_;
  SetUnknownFieldsVariable
            (pMVar18->descriptor_,options,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_158);
  Formatter::AddMap(&local_e8,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_158);
  bVar6 = UsingImplicitWeakFields(*(FileDescriptor **)(pMVar18->descriptor_ + 0x10),options);
  if (bVar6) {
    Formatter::operator()<>
              (&local_e8,
               "$classname$::$classname$(const $classname$& from)\n  : $classname$() {\n  MergeFrom(from);\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              (&local_e8,"$classname$::$classname$(const $classname$& from)\n  : $superclass$()");
    io::Printer::Indent(local_e8.printer_);
    io::Printer::Indent(local_e8.printer_);
    io::Printer::Indent(local_e8.printer_);
    if ((pMVar18->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar18->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>(&local_e8,",\n_has_bits_(from._has_bits_)");
    }
    local_1d0._M_dataplus._M_p = local_1d0._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1b0,
               (long)(pMVar18->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pMVar18->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_1d0,
               (allocator_type *)&local_178);
    ppFVar10 = (pMVar18->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar18->optimized_order_).
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppFVar10) {
      uVar15 = 0;
      do {
        pFVar4 = ppFVar10[uVar15];
        if ((~(byte)pFVar4[1] & 0x60) == 0) {
          if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
            local_1d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_178 = pFVar4;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_1d0,
                       &local_178);
          }
          if ((pFVar4[2] == (FieldDescriptor)0xb) &&
             (bVar6 = FieldDescriptor::is_map_message_type(pFVar4), bVar6)) goto LAB_002a92b1;
LAB_002a92ec:
          *(ulong *)(local_1b0._0_8_ + (long)(uVar15 >> 6) * 8) =
               *(ulong *)(local_1b0._0_8_ + (long)(uVar15 >> 6) * 8) | 1L << ((byte)uVar15 & 0x3f);
          FieldName_abi_cxx11_(&local_1d0,(cpp *)pFVar4,(FieldDescriptor *)(uVar15 >> 6));
          Formatter::operator()(&local_e8,",\n$1$_(from.$1$_)",&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
        }
        else {
LAB_002a92b1:
          if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
            local_1d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_178 = pFVar4;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_1d0,
                       &local_178);
          }
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4) == 9) &&
             (CVar7 = EffectiveStringCType(pFVar4,options), CVar7 == FieldOptions_CType_CORD))
          goto LAB_002a92ec;
        }
        uVar15 = uVar15 + 1;
        ppFVar10 = (local_188->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar15 < (ulong)((long)(local_188->optimized_order_).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >>
                               3));
    }
    pMVar18 = local_188;
    bVar6 = IsAnyMessage(local_188->descriptor_,options);
    if (bVar6) {
      Formatter::operator()<>(&local_e8,",\n_any_metadata_(&type_url_, &value_)");
    }
    if (0 < pMVar18->num_weak_fields_) {
      Formatter::operator()<>(&local_e8,",\n_weak_field_map_(from._weak_field_map_)");
    }
    io::Printer::Outdent(local_e8.printer_);
    io::Printer::Outdent(local_e8.printer_);
    Formatter::operator()<>(&local_e8," {\n");
    Formatter::operator()<>
              (&local_e8,
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    if (0 < *(int *)(pMVar18->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&local_e8,
                 "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_78,(vector<bool,_std::allocator<bool>_> *)local_1b0);
    GenerateConstructorBody(pMVar18,local_180,&local_78,true);
    if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    local_170 = pMVar18->descriptor_;
    local_178 = (FieldDescriptor *)((ulong)local_178 & 0xffffffff00000000);
    local_40.idx = *(int *)(local_170 + 0x6c);
    local_40.descriptor = local_170;
    while (bVar6 = operator==((Iterator *)&local_178,&local_40), !bVar6) {
      lVar13 = (long)(int)local_178;
      lVar5 = *(long *)(local_170 + 0x30);
      Formatter::operator()
                (&local_e8,"clear_has_$1$();\nswitch (from.$1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar5 + 8 + lVar13 * 0x28));
      io::Printer::Indent(local_e8.printer_);
      local_90.descriptor = (OneofDescriptor *)(lVar5 + lVar13 * 0x28);
      local_90.idx = 0;
      local_50.idx = *(int *)(local_90.descriptor + 4);
      local_80 = local_90.descriptor;
      local_50.descriptor = local_90.descriptor;
      while (bVar6 = operator==(&local_90,&local_50), !bVar6) {
        lVar13 = (long)local_90.idx;
        lVar5 = *(long *)(local_90.descriptor + 0x20);
        UnderscoresToCamelCase(&local_1d0,*(string **)(lVar5 + 8 + lVar13 * 0x48),true);
        Formatter::operator()(&local_e8,"case k$1$: {\n",&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        io::Printer::Indent(local_e8.printer_);
        pFVar11 = FieldGeneratorMap::get
                            (&pMVar18->field_generators_,(FieldDescriptor *)(lVar5 + lVar13 * 0x48))
        ;
        (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,local_180);
        Formatter::operator()<>(&local_e8,"break;\n");
        io::Printer::Outdent(local_e8.printer_);
        Formatter::operator()<>(&local_e8,"}\n");
        local_90.idx = local_90.idx + 1;
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      lVar5 = **(long **)(local_80 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,lVar5,(*(long **)(local_80 + 8))[1] + lVar5);
      if (local_1d0._M_string_length != 0) {
        sVar14 = 0;
        do {
          if ((byte)(local_1d0._M_dataplus._M_p[sVar14] + 0x9fU) < 0x1a) {
            local_1d0._M_dataplus._M_p[sVar14] = local_1d0._M_dataplus._M_p[sVar14] + -0x20;
          }
          sVar14 = sVar14 + 1;
        } while (local_1d0._M_string_length != sVar14);
      }
      Formatter::operator()(&local_e8,"case $1$_NOT_SET: {\n  break;\n}\n",&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      io::Printer::Outdent(local_e8.printer_);
      Formatter::operator()<>(&local_e8,"}\n");
      local_178 = (FieldDescriptor *)CONCAT44(local_178._4_4_,(int)local_178 + 1);
    }
    io::Printer::Outdent(local_e8.printer_);
    pMVar18 = local_188;
    Formatter::operator()<>
              (&local_e8,"  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n");
    if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)0x0) {
      operator_delete((void *)local_1b0._0_8_);
      local_1b0._0_8_ = (FieldDescriptor *)0x0;
      local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffff00000000;
      local_1a0 = (Descriptor *)0x0;
      uStack_198 = 0;
      local_190 = (_Bit_pointer)0x0;
    }
  }
  GenerateSharedConstructorCode(pMVar18,local_180);
  pDVar17 = pMVar18->descriptor_;
  FVar8 = GetOptimizeFor(*(FileDescriptor **)(pDVar17 + 0x10),options,(bool *)0x0);
  if (((FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar17 + 0x78) != 0)) ||
     (*(int *)(pDVar17 + 4) != 0)) {
    Formatter::operator()<>
              (&local_e8,
               "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  if (GetArenaForAllocation() != nullptr) return;\n  SharedDtor();\n  _internal_metadata_.Delete<$unknown_fields_type$>();\n}\n\n"
              );
  }
  GenerateSharedDestructorCode(pMVar18,local_180);
  GenerateArenaDestructorCode(pMVar18,local_180);
  pDVar17 = pMVar18->descriptor_;
  FVar8 = GetOptimizeFor(*(FileDescriptor **)(pDVar17 + 0x10),options,(bool *)0x0);
  if (((FVar8 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar17 + 0x78) != 0)) ||
     (*(int *)(pDVar17 + 4) != 0)) {
    Formatter::operator()<>
              (&local_e8,
               "void $classname$::SetCachedSize(int size) const {\n  _cached_size_.Set(size);\n}\n")
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e8.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateStructors(io::Printer* printer) {
  Formatter format(printer, variables_);

  std::string superclass;
  superclass = SuperClassName(descriptor_, options_);
  std::string initializer_with_arena = superclass + "(arena, is_message_owned)";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  // Initialize member variables with arena constructor.
  for (auto field : optimized_order_) {
    GOOGLE_DCHECK(!IsFieldStripped(field, options_));
    bool has_arena_constructor = field->is_repeated();
    if (!field->real_containing_oneof() &&
        (IsLazy(field, options_, scc_analyzer_) ||
         IsStringPiece(field, options_) ||
         (IsString(field, options_) && IsStringInlined(field, options_)))) {
      has_arena_constructor = true;
    }
    if (has_arena_constructor) {
      initializer_with_arena +=
          std::string(",\n  ") + FieldName(field) + std::string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_, options_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  std::string initializer_null = superclass + "()";
  if (IsAnyMessage(descriptor_, options_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(nullptr)";
  }

  format(
      "$classname$::$classname$(::$proto_ns$::Arena* arena,\n"
      "                         bool is_message_owned)\n"
      "  : $1$ {\n",
      initializer_with_arena);

  if (!inlined_string_indices_.empty()) {
    // Donate inline string fields.
    format("  if (arena != nullptr) {\n");
    for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
      format("    _inlined_string_donated_[$1$] = ~0u;\n", i);
    }
    format("  }\n");
  }

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "  SharedCtor();\n"
        "  if (!is_message_owned) {\n"
        "    RegisterArenaDtor(arena);\n"
        "  }\n");
  }
  format(
      "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
      "}\n");

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Generate the copy constructor.
  if (UsingImplicitWeakFields(descriptor_->file(), options_)) {
    // If we are in lite mode and using implicit weak fields, we generate a
    // one-liner copy constructor that delegates to MergeFrom. This saves some
    // code size and also cuts down on the complexity of implicit weak fields.
    // We might eventually want to do this for all lite protos.
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $classname$() {\n"
        "  MergeFrom(from);\n"
        "}\n");
  } else {
    format(
        "$classname$::$classname$(const $classname$& from)\n"
        "  : $superclass$()");
    format.Indent();
    format.Indent();
    format.Indent();

    // Do not copy inlined_string_donated_, because this is not an arena
    // constructor.

    if (!has_bit_indices_.empty()) {
      format(",\n_has_bits_(from._has_bits_)");
    }

    std::vector<bool> processed(optimized_order_.size(), false);
    for (int i = 0; i < optimized_order_.size(); i++) {
      auto field = optimized_order_[i];
      if (!(field->is_repeated() && !(field->is_map())) &&
          !IsCord(field, options_)) {
        continue;
      }

      processed[i] = true;
      format(",\n$1$_(from.$1$_)", FieldName(field));
    }

    if (IsAnyMessage(descriptor_, options_)) {
      format(",\n_any_metadata_(&type_url_, &value_)");
    }
    if (num_weak_fields_ > 0) {
      format(",\n_weak_field_map_(from._weak_field_map_)");
    }

    format.Outdent();
    format.Outdent();
    format(" {\n");

    format(
        "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
        "metadata_);\n");

    if (descriptor_->extension_range_count() > 0) {
      format(
          "_extensions_.MergeFrom(internal_default_instance(), "
          "from._extensions_);\n");
    }

    GenerateConstructorBody(printer, processed, true);

    // Copy oneof fields. Oneof field requires oneof case check.
    for (auto oneof : OneOfRange(descriptor_)) {
      format(
          "clear_has_$1$();\n"
          "switch (from.$1$_case()) {\n",
          oneof->name());
      format.Indent();
      for (auto field : FieldRange(oneof)) {
        format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
        format.Indent();
        if (!IsFieldStripped(field, options_)) {
          field_generators_.get(field).GenerateMergingCode(printer);
        }
        format("break;\n");
        format.Outdent();
        format("}\n");
      }
      format(
          "case $1$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          ToUpper(oneof->name()));
      format.Outdent();
      format("}\n");
    }

    format.Outdent();
    format(
        "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
        "}\n"
        "\n");
  }

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  if (!HasSimpleBaseClass(descriptor_, options_)) {
    format(
        "$classname$::~$classname$() {\n"
        "  // @@protoc_insertion_point(destructor:$full_name$)\n"
        "  if (GetArenaForAllocation() != nullptr) return;\n"
        "  SharedDtor();\n"
        "  _internal_metadata_.Delete<$unknown_fields_type$>();\n"
        "}\n"
        "\n");
  } else {
    // For messages using simple base classes, having no destructor
    // allows our vtable to share the same destructor as every other
    // message with a simple base class.  This works only as long as
    // we have no fields needing destruction, of course.  (No strings
    // or extensions)
  }

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  GenerateArenaDestructorCode(printer);

  if (!HasSimpleBaseClass(descriptor_, options_)) {
    // Generate SetCachedSize.
    format(
        "void $classname$::SetCachedSize(int size) const {\n"
        "  _cached_size_.Set(size);\n"
        "}\n");
  }
}